

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O0

int accum_state_mean(vector_t ***mean,float32 ***dnom,vector_t **feat,uint32 n_feat,uint32 *veclen,
                    uint32 *sseq,uint32 *ci_sseq,uint32 n_frame)

{
  uint local_4c;
  uint local_48;
  uint32 c;
  uint32 f;
  uint32 ci_s;
  uint32 s;
  uint32 t;
  uint32 *sseq_local;
  uint32 *veclen_local;
  uint32 n_feat_local;
  vector_t **feat_local;
  float32 ***dnom_local;
  vector_t ***mean_local;
  
  for (ci_s = 0; ci_s < n_frame; ci_s = ci_s + 1) {
    if ((sseq == (uint32 *)0x0) || (ci_sseq == (uint32 *)0x0)) {
      f = 0;
      c = 0;
    }
    else {
      f = sseq[ci_s];
      c = ci_sseq[ci_s];
    }
    for (local_48 = 0; local_48 < n_feat; local_48 = local_48 + 1) {
      *dnom[f][local_48] = (float32)((float)*dnom[f][local_48] + 1.0);
      if (f != c) {
        *dnom[c][local_48] = (float32)((float)*dnom[c][local_48] + 1.0);
      }
      for (local_4c = 0; local_4c < veclen[local_48]; local_4c = local_4c + 1) {
        (*mean[f][local_48])[local_4c] =
             feat[ci_s][local_48][local_4c] + (*mean[f][local_48])[local_4c];
        if (f != c) {
          (*mean[c][local_48])[local_4c] =
               feat[ci_s][local_48][local_4c] + (*mean[c][local_48])[local_4c];
        }
      }
    }
  }
  return 0;
}

Assistant:

int
accum_state_mean(vector_t ***mean,
		 float32 ***dnom,
		 vector_t **feat,
		 uint32 n_feat,
		 const uint32 *veclen,
		 uint32 *sseq,
		 uint32 *ci_sseq,
		 uint32 n_frame)
{
    uint32 t;		/* time (in frames) */
    uint32 s;		/* a tied state */
    uint32 ci_s;	/* a CI tied state */
    uint32 f;		/* a feature stream idx */
    uint32 c;		/* a vector component idx */

    for (t = 0; t < n_frame; t++) {
	if (sseq && ci_sseq) {
	    s = sseq[t];
	    ci_s = ci_sseq[t];
	}
	else {
	    s = 0;
	    ci_s = 0;
	}

	for (f = 0; f < n_feat; f++) {
	    dnom[s][f][0] += 1.0;
	    if (s != ci_s) {
		dnom[ci_s][f][0] += 1.0;
	    }
	    for (c = 0; c < veclen[f]; c++) {
		/* only one Gaussian per state */
    		mean[s][f][0][c] += feat[t][f][c];

		if (s != ci_s) {
		    mean[ci_s][f][0][c] += feat[t][f][c];
		}
	    }
	}
    }
    return 0;
}